

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::GenerateMemberConstructor
          (SingularStringView *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if ((this->super_FieldGeneratorBase).is_inlined_ == true) {
    pcVar2 = "$name$_{}";
    uVar1 = 9;
  }
  else if (((((this->super_FieldGeneratorBase).field_)->field_20).default_value_enum_)->all_names_
           == (string *)0x0) {
    pcVar2 = "$name$_(arena)";
    uVar1 = 0xe;
  }
  else if (this->opts_->experimental_use_micro_string == true) {
    pcVar2 = "$name$_($default_variable_field$)";
    uVar1 = 0x21;
  }
  else {
    pcVar2 = "$name$_(arena, $default_variable_field$)";
    uVar1 = 0x28;
  }
  io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateMemberConstructor(io::Printer* p) const override {
    if (is_inlined()) {
      p->Emit("$name$_{}");
    } else if (EmptyDefault()) {
      p->Emit("$name$_(arena)");
    } else if (use_micro_string()) {
      p->Emit("$name$_($default_variable_field$)");
    } else {
      p->Emit("$name$_(arena, $default_variable_field$)");
    }
  }